

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O2

Image * Test_Helper::uniformImage
                  (Image *__return_storage_ptr__,uint8_t value,uint32_t width,uint32_t height,
                  Image *reference)

{
  if (width == 0) {
    width = anon_unknown.dwarf_12526a::randomSize();
  }
  if (height == 0) {
    height = anon_unknown.dwarf_12526a::randomSize();
  }
  anon_unknown.dwarf_12526a::generateImage
            (__return_storage_ptr__,width,height,'\x01',value,reference);
  return __return_storage_ptr__;
}

Assistant:

PenguinV_Image::Image uniformImage( uint8_t value, uint32_t width, uint32_t height, const PenguinV_Image::Image & reference )
    {
        return generateImage( (width > 0u) ? width : randomSize(), (height > 0u) ? height : randomSize(), PenguinV_Image::GRAY_SCALE, value, reference );
    }